

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

RequiredExtensions *
deqp::gls::TextureStateQueryTests::anon_unknown_1::getTextureParamExtension
          (RequiredExtensions *__return_storage_ptr__,ContextType *contextType,GLenum pname)

{
  bool bVar1;
  char *ext;
  
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
    if (!bVar1) {
      glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
      goto LAB_007e348e;
    }
    if (pname == 0x1004) {
      ext = "GL_EXT_texture_border_clamp";
      goto LAB_007e3477;
    }
  }
  if (pname == 0x8a48) {
    ext = "GL_EXT_texture_sRGB_decode";
LAB_007e3477:
    RequiredExtensions::RequiredExtensions(__return_storage_ptr__,ext);
    return __return_storage_ptr__;
  }
LAB_007e348e:
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

static RequiredExtensions getTextureParamExtension (const glu::ContextType& contextType, glw::GLenum pname)
{
	DE_ASSERT(!isCoreTextureParam(contextType, pname));

	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::getTextureParamExtension(pname);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::getTextureParamExtension(pname);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::getTextureParamExtension(pname);
	else
	{
		DE_ASSERT(false);
		return RequiredExtensions();
	}
}